

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O0

int cfg_cmd_handle_query(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *arg_00;
  const_strarray *pcVar2;
  size_t sVar3;
  bool bVar4;
  int local_6c;
  int result;
  char *arg_copy;
  char *tmp;
  const_strarray *array;
  _parsed_argument pa;
  autobuf *log_local;
  char *arg_local;
  cfg_db *db_local;
  cfg_instance *instance_local;
  
  pa.entry_value = (char *)log;
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    cfg_append_printable_line(log,"Query needs section and key, but no value: %s",arg);
    instance_local._4_4_ = 0;
  }
  else {
    arg_00 = strdup(arg);
    if (arg_00 == (char *)0x0) {
      instance_local._4_4_ = -1;
    }
    else {
      local_6c = -1;
      iVar1 = _do_parse_arg(arg_00,(_parsed_argument *)&array,(autobuf *)pa.entry_value);
      if (iVar1 == 0) {
        if ((pa.section_name == (char *)0x0) || (pa.entry_key != (char *)0x0)) {
          cfg_append_printable_line
                    ((autobuf *)pa.entry_value,"Query needs section and key, but no value: %s",arg);
        }
        else {
          pcVar2 = cfg_db_get_entry_value(db,(char *)array,pa.section_type,pa.section_name);
          if (pcVar2 == (const_strarray *)0x0) {
            cfg_append_printable_line((autobuf *)pa.entry_value,"Key \'%s\' has no value:",arg);
          }
          else {
            cfg_append_printable_line((autobuf *)pa.entry_value,"Key \'%s\' has value:",arg);
            arg_copy = pcVar2->value;
            while( true ) {
              bVar4 = false;
              if (arg_copy != (char *)0x0) {
                bVar4 = arg_copy < pcVar2->value + pcVar2->length;
              }
              if (!bVar4) break;
              cfg_append_printable_line((autobuf *)pa.entry_value,"%s",arg_copy);
              sVar3 = strlen(arg_copy);
              arg_copy = arg_copy + sVar3 + 1;
            }
            local_6c = 0;
          }
        }
      }
      free(arg_00);
      instance_local._4_4_ = local_6c;
    }
  }
  return instance_local._4_4_;
}

Assistant:

int
cfg_cmd_handle_query(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct _parsed_argument pa;
  const struct const_strarray *array;
  const char *tmp;
  char *arg_copy;
  int result;

  if (arg == NULL || *arg == 0) {
    cfg_append_printable_line(log, "Query needs section and key, but no value: %s", arg);
    return 0;
  }

  arg_copy = strdup(arg);
  if (!arg_copy) {
    return -1;
  }

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(arg_copy, &pa, log)) {
    goto handle_get_cleanup;
  }

  if (pa.entry_key == NULL || pa.entry_value != NULL) {
    cfg_append_printable_line(log, "Query needs section and key, but no value: %s", arg);
    goto handle_get_cleanup;
  }

  array = cfg_db_get_entry_value(db, pa.section_type, pa.section_name, pa.entry_key);
  if (array) {
    cfg_append_printable_line(log, "Key '%s' has value:", arg);
    strarray_for_each_element(array, tmp) {
      cfg_append_printable_line(log, "%s", tmp);
    }
    result = 0;
  }
  else {
    cfg_append_printable_line(log, "Key '%s' has no value:", arg);
  }

handle_get_cleanup:
  free(arg_copy);
  return result;
}